

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTendonAnchor::~IfcTendonAnchor(IfcTendonAnchor *this)

{
  IfcElement *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = (IfcElement *)
            &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x28;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x28 = 0x896fd0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x10 = 0x897110;
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x18) = 0x896ff8;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xc0 = 0x897020;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.Representation.have = 0x897048;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x128 = 0x897070;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.field_0x160
       = 0x897098;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x170 = 0x8970c0;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x180 = 0x8970e8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcReinforcingElement.field_0x190;
  puVar2 = &this[-1].super_IfcReinforcingElement.field_0x1a0;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__00896d98);
  operator_delete(this_00,0x1b8);
  return;
}

Assistant:

IfcTendonAnchor() : Object("IfcTendonAnchor") {}